

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_double_parser.h
# Opt level: O3

char * fast_double_parser::parse_float_strtod(char *ptr,double *outDouble)

{
  char *in_RAX;
  double dVar1;
  char *endptr;
  char *local_18;
  
  local_18 = in_RAX;
  if (parse_float_strtod(char_const*,double*)::c_locale == '\0') {
    parse_float_strtod();
  }
  dVar1 = strtod_l(ptr,&local_18,(__locale_t)parse_float_strtod::c_locale);
  *outDouble = dVar1;
  if (0x7fefffffffffffff < (ulong)ABS(dVar1)) {
    local_18 = (char *)0x0;
  }
  return local_18;
}

Assistant:

static const char * parse_float_strtod(const char *ptr, double *outDouble) {
  char *endptr;
#if defined(FAST_DOUBLE_PARSER_SOLARIS) || defined(FAST_DOUBLE_PARSER_CYGWIN) 
  // workround for cygwin, solaris
  *outDouble = cygwin_strtod_l(ptr, &endptr);
#elif defined(_WIN32)
  static _locale_t c_locale = _create_locale(LC_ALL, "C");
  *outDouble = _strtod_l(ptr, &endptr, c_locale);
#elif defined(__PASE__)
  *outDouble = strtod(ptr, &endptr);
#else
  static locale_t c_locale = newlocale(LC_ALL_MASK, "C", NULL);
  *outDouble = strtod_l(ptr, &endptr, c_locale);
#endif
  // Some libraries will set errno = ERANGE when the value is subnormal,
  // yet we may want to be able to parse subnormal values.
  // However, we do not want to tolerate NAN or infinite values.
  // There isno realistic application where you might need values so large than
  // they can't fit in binary64. The maximal value is about  1.7976931348623157
  // × 10^308 It is an unimaginable large number. There will never be any piece
  // of engineering involving as many as 10^308 parts. It is estimated that
  // there are about 10^80 atoms in the universe. The estimate for the total
  // number of electrons is similar. Using a double-precision floating-point
  // value, we can represent easily the number of atoms in the universe. We
  // could  also represent the number of ways you can pick any three individual
  // atoms at random in the universe.
  if (!std::isfinite(*outDouble)) {
    return nullptr;
  }
  return endptr;
}